

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::removeScaleFactors
          (BeagleCPUImpl<double,_1,_0> *this,int *scalingIndices,int count,
          int cumulativeScalingIndex)

{
  long lVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  double dVar3;
  int j;
  double *scaleBuffer;
  int i;
  double *cumulativeScaleBuffer;
  undefined4 local_34;
  undefined4 local_24;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)in_ECX * 8);
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    lVar2 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)*(int *)(in_RSI + (long)local_24 * 4) * 8);
    for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x14); local_34 = local_34 + 1) {
      if ((*(ulong *)(in_RDI + 0x58) & 0x400) == 0) {
        dVar3 = log(*(double *)(lVar2 + (long)local_34 * 8));
        *(double *)(lVar1 + (long)local_34 * 8) = *(double *)(lVar1 + (long)local_34 * 8) - dVar3;
      }
      else {
        *(double *)(lVar1 + (long)local_34 * 8) =
             *(double *)(lVar1 + (long)local_34 * 8) - *(double *)(lVar2 + (long)local_34 * 8);
      }
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::removeScaleFactors(const int* scalingIndices,
                                                          int  count,
                                                          int  cumulativeScalingIndex) {
    REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
    for(int i=0; i<count; i++) {
        const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
        for(int j=0; j<kPatternCount; j++) {
            if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                cumulativeScaleBuffer[j] -= scaleBuffer[j];
            else
                cumulativeScaleBuffer[j] -= log(scaleBuffer[j]);
        }
    }

    return BEAGLE_SUCCESS;
}